

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereRecord2.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SphereRecord2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SphereRecord2 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  BoundingSphereRecord::GetAsString_abi_cxx11_(&local_1c0,(BoundingSphereRecord *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\td(Radius)/dt: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32ddt);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tVelocity: ");
  Vector::GetAsString_abi_cxx11_(&local_1e0,&this->m_Velocity);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tAngularVelocity: ");
  Vector::GetAsString_abi_cxx11_(&local_200,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SphereRecord2::GetAsString() const
{
    KStringStream ss;

    ss << BoundingSphereRecord::GetAsString()
       << "\td(Radius)/dt: "    << m_f32ddt   << "\n"
       << "\tVelocity: "        << m_Velocity.GetAsString()
       << "\tAngularVelocity: " << m_AngularVelocity.GetAsString();

    return ss.str();
}